

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

void __thiscall leveldb::Iterator::~Iterator(Iterator *this)

{
  Cleanup *pCVar1;
  Cleanup *next;
  Cleanup *c;
  Iterator *this_local;
  
  this->_vptr_Iterator = (_func_int **)&PTR__Iterator_0015f430;
  if ((this->cleanup_).function != (CleanupFunction)0x0) {
    (*(this->cleanup_).function)((this->cleanup_).arg1,(this->cleanup_).arg2);
    pCVar1 = (this->cleanup_).next;
    while (next = pCVar1, next != (Cleanup *)0x0) {
      (*next->function)(next->arg1,next->arg2);
      pCVar1 = next->next;
      if (next != (Cleanup *)0x0) {
        operator_delete(next);
      }
    }
  }
  return;
}

Assistant:

Iterator::~Iterator() {
        if (cleanup_.function != NULL) {
            (*cleanup_.function)(cleanup_.arg1, cleanup_.arg2);
            for (Cleanup *c = cleanup_.next; c != NULL;) {
                (*c->function)(c->arg1, c->arg2);
                Cleanup *next = c->next;
                delete c;
                c = next;
            }
        }
    }